

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcStatesStates
          (BeagleCPUImpl<double,_1,_0> *this,double *destP,int *states1,double *matrices1,
          int *states2,double *matrices2,int startPattern,int endPattern)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  int local_64;
  
  iVar1 = this->kCategoryCount;
  if (0 < iVar1) {
    iVar11 = 0;
    local_64 = 0;
    iVar2 = this->kPartialsPaddedStateCount;
    iVar3 = this->kPatternCount;
    iVar4 = this->kStateCount;
    iVar5 = this->kMatrixSize;
    do {
      if (startPattern < endPattern) {
        iVar14 = (iVar3 * local_64 + startPattern) * iVar2;
        iVar6 = this->kTransPaddedStateCount;
        lVar13 = (long)startPattern;
        do {
          if (0 < iVar4) {
            iVar7 = states1[lVar13];
            iVar8 = states2[lVar13];
            lVar15 = 0;
            lVar12 = (long)iVar11;
            do {
              lVar9 = iVar7 + lVar12;
              lVar10 = iVar8 + lVar12;
              lVar12 = lVar12 + iVar6;
              destP[iVar14 + lVar15] = matrices1[lVar9] * matrices2[lVar10];
              lVar15 = lVar15 + 1;
            } while (iVar4 != (int)lVar15);
            iVar14 = iVar14 + (int)lVar15;
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 != endPattern);
      }
      iVar11 = iVar11 + iVar5;
      local_64 = local_64 + 1;
    } while (local_64 != iVar1);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcStatesStates(REALTYPE* destP,
                                                         const int* states1,
                                                         const REALTYPE* matrices1,
                                                         const int* states2,
                                                         const REALTYPE* matrices2,
                                                         int startPattern,
                                                         int endPattern) {

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
        for (int k = startPattern; k < endPattern; k++) {
            const int state1 = states1[k];
            const int state2 = states2[k];
            if (DEBUGGING_OUTPUT) {
                std::cerr << "calcStatesStates s1 = " << state1 << '\n';
                std::cerr << "calcStatesStates s2 = " << state2 << '\n';
            }
            int w = l * kMatrixSize;
            for (int i = 0; i < kStateCount; i++) {
                destP[v] = matrices1[w + state1] * matrices2[w + state2];
                v++;

                w += kTransPaddedStateCount;
            }
            if (P_PAD) {
                for (int pad = 0; pad < P_PAD; pad++)  {
                    destP[v] = 0.0;
                    v++;
                }
            }
        }
    }
}